

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaAttDef::SchemaAttDef
          (SchemaAttDef *this,XMLCh *prefix,XMLCh *localPart,int uriId,AttTypes type,
          DefAttTypes defType,MemoryManager *manager)

{
  QName *this_00;
  
  XMLAttDef::XMLAttDef(&this->super_XMLAttDef,type,defType,manager);
  (this->super_XMLAttDef).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__SchemaAttDef_00407e38;
  this->fElemId = 0xfffffffe;
  this->fPSVIScope = SCP_ABSENT;
  this->fDatatypeValidator = (DatatypeValidator *)0x0;
  this->fNamespaceList = (ValueVectorOf<unsigned_int> *)0x0;
  this->fBaseAttDecl = (SchemaAttDef *)0x0;
  this_00 = (QName *)XMemory::operator_new(0x48,manager);
  QName::QName(this_00,prefix,localPart,uriId,manager);
  this->fAttName = this_00;
  return;
}

Assistant:

SchemaAttDef::SchemaAttDef( const XMLCh* const           prefix
                          , const XMLCh* const           localPart
                          , const int                    uriId
                          , const XMLAttDef::AttTypes    type
                          , const XMLAttDef::DefAttTypes defType
                          , MemoryManager* const         manager) :
    XMLAttDef(type, defType, manager)
    , fElemId(XMLElementDecl::fgInvalidElemId)
    , fPSVIScope(PSVIDefs::SCP_ABSENT)
    , fDatatypeValidator(0)
    , fNamespaceList(0)
    , fBaseAttDecl(0)
{
    fAttName = new (manager) QName(prefix, localPart, uriId, manager);
}